

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash.cpp
# Opt level: O0

uint64_t MurmurHash64A(void *key,int len,uint seed)

{
  ulong uVar1;
  uchar *data2;
  uint64_t k;
  uint64_t *end;
  uint64_t *data;
  uint64_t h;
  int r;
  uint64_t m;
  uint seed_local;
  int len_local;
  void *key_local;
  
  data = (uint64_t *)((ulong)seed ^ (long)len * -0x395b586ca42e166b);
  for (end = (uint64_t *)key; end != (uint64_t *)((long)key + (long)(len / 8) * 8); end = end + 1) {
    data = (uint64_t *)
           (((*end * -0x395b586ca42e166b >> 0x2f ^ *end * -0x395b586ca42e166b) * -0x395b586ca42e166b
            ^ (ulong)data) * -0x395b586ca42e166b);
  }
  switch(len & 7) {
  case 7:
    data = (uint64_t *)((ulong)*(byte *)((long)end + 6) << 0x30 ^ (ulong)data);
  case 6:
    data = (uint64_t *)((ulong)*(byte *)((long)end + 5) << 0x28 ^ (ulong)data);
  case 5:
    data = (uint64_t *)((ulong)*(byte *)((long)end + 4) << 0x20 ^ (ulong)data);
  case 4:
    data = (uint64_t *)((ulong)*(byte *)((long)end + 3) << 0x18 ^ (ulong)data);
  case 3:
    data = (uint64_t *)((ulong)*(byte *)((long)end + 2) << 0x10 ^ (ulong)data);
  case 2:
    data = (uint64_t *)((ulong)*(byte *)((long)end + 1) << 8 ^ (ulong)data);
  case 1:
    data = (uint64_t *)(((ulong)(byte)*end ^ (ulong)data) * -0x395b586ca42e166b);
  default:
    uVar1 = ((ulong)data >> 0x2f ^ (ulong)data) * -0x395b586ca42e166b;
    return uVar1 >> 0x2f ^ uVar1;
  }
}

Assistant:

uint64_t MurmurHash64A(const void *key, int len, unsigned int seed) {
    const uint64_t m = 0xc6a4a7935bd1e995;
    const int r = 47;

    uint64_t h = seed ^(len * m);

    const uint64_t *data = (const uint64_t *)key;
    const uint64_t *end = data + (len / 8);

    while (data != end) {
        uint64_t k = *data++;

        k *= m;
        k ^= k >> r;
        k *= m;

        h ^= k;
        h *= m;
    }

    const unsigned char *data2 = (const unsigned char *) data;

    switch (len & 7) {
        case 7:
            h ^= uint64_t(data2[6]) << 48;
        case 6:
            h ^= uint64_t(data2[5]) << 40;
        case 5:
            h ^= uint64_t(data2[4]) << 32;
        case 4:
            h ^= uint64_t(data2[3]) << 24;
        case 3:
            h ^= uint64_t(data2[2]) << 16;
        case 2:
            h ^= uint64_t(data2[1]) << 8;
        case 1:
            h ^= uint64_t(data2[0]);
            h *= m;
    };

    h ^= h >> r;
    h *= m;
    h ^= h >> r;

    return h;
}